

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testDebuggerVariablesHelper.cxx
# Opt level: O3

Dummies * CreateDummies(Dummies *__return_storage_ptr__,string *targetName,
                       string *currentSourceDirectory,string *currentBinaryDirectory)

{
  __uniq_ptr_impl<cmState,_std::default_delete<cmState>_> this;
  cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *pcVar1;
  cmake *__tmp;
  cmGlobalGenerator *__tmp_1;
  pair<cmTarget_&,_bool> pVar2;
  cmStateSnapshot snapshot;
  undefined1 local_79;
  cmMakefile *local_78;
  cmStateDirectory local_70;
  cmStateSnapshot local_48;
  
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_48.State = (cmState *)CONCAT44(local_48.State._4_4_,2);
  local_78 = (cmMakefile *)CONCAT44(local_78._4_4_,1);
  local_70.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmake,std::allocator<cmake>,cmake::Role,cmState::Mode>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.DirectoryState.Position,
             (cmake **)&local_70,(allocator<cmake> *)&local_79,(Role *)&local_48,(Mode *)&local_78);
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70.DirectoryState.Tree;
  (__return_storage_ptr__->CMake).super___shared_ptr<cmake,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.DirectoryState.Position;
  this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
  super__Head_base<0UL,_cmState_*,_false>._M_head_impl =
       (((unique_ptr<cmState,_std::default_delete<cmState>_> *)
        ((long)local_70.DirectoryState.Tree + 0x778))->_M_t).
       super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t;
  local_48.State = (cmState *)local_70.DirectoryState.Tree;
  local_70.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmGlobalGenerator,std::allocator<cmGlobalGenerator>,cmake*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.DirectoryState.Position,
             (cmGlobalGenerator **)&local_70,(allocator<cmGlobalGenerator> *)&local_78,
             (cmake **)&local_48);
  pcVar1 = local_70.DirectoryState.Tree;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_70.DirectoryState.Tree;
  (__return_storage_ptr__->GlobalGenerator).
  super___shared_ptr<cmGlobalGenerator,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.DirectoryState.Position;
  cmState::CreateBaseSnapshot
            (&local_48,
             (cmState *)
             this._M_t.super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  cmStateSnapshot::GetDirectory(&local_70,&local_48);
  cmStateDirectory::SetCurrentSource(&local_70,currentSourceDirectory);
  cmStateSnapshot::GetDirectory(&local_70,&local_48);
  cmStateDirectory::SetCurrentBinary(&local_70,currentBinaryDirectory);
  local_78 = (cmMakefile *)pcVar1;
  local_70.DirectoryState.Tree = (cmLinkedTree<cmStateDetail::BuildsystemDirectoryStateType> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<cmMakefile,std::allocator<cmMakefile>,cmGlobalGenerator*,cmStateSnapshot&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70.DirectoryState.Position,
             (cmMakefile **)&local_70,(allocator<cmMakefile> *)&local_79,
             (cmGlobalGenerator **)&local_78,&local_48);
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)local_70.DirectoryState.Tree;
  (__return_storage_ptr__->Makefile).super___shared_ptr<cmMakefile,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70.DirectoryState.Position;
  pVar2 = cmMakefile::CreateNewTarget
                    ((cmMakefile *)local_70.DirectoryState.Tree,targetName,EXECUTABLE,Yes,Normal);
  return (Dummies *)pVar2.first;
}

Assistant:

static Dummies CreateDummies(
  std::string targetName,
  std::string currentSourceDirectory = "c:/CurrentSourceDirectory",
  std::string currentBinaryDirectory = "c:/CurrentBinaryDirectory")
{
  Dummies dummies;
  dummies.CMake =
    std::make_shared<cmake>(cmake::RoleProject, cmState::Project);
  cmState* state = dummies.CMake->GetState();
  dummies.GlobalGenerator =
    std::make_shared<cmGlobalGenerator>(dummies.CMake.get());
  cmStateSnapshot snapshot = state->CreateBaseSnapshot();
  snapshot.GetDirectory().SetCurrentSource(currentSourceDirectory);
  snapshot.GetDirectory().SetCurrentBinary(currentBinaryDirectory);
  dummies.Makefile =
    std::make_shared<cmMakefile>(dummies.GlobalGenerator.get(), snapshot);
  dummies.Makefile->CreateNewTarget(targetName, cmStateEnums::EXECUTABLE);
  return dummies;
}